

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprImpliesNonNullRow(Expr *p,int iTab,int isRJ)

{
  u8 uVar1;
  int iVar2;
  uint uVar3;
  ExprList_item *pEVar4;
  long in_FS_OFFSET;
  undefined1 local_58 [36];
  ushort uStack_34;
  anon_union_8_18_67db040d_for_u aStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  if (p != (Expr *)0x0) {
    stack0xffffffffffffffc8 = &DAT_aaaaaaaaaaaaaaaa;
    aStack_30.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    do {
      uVar3 = 0;
      if ((p->flags & 0x82000) == 0) {
        uVar1 = p->op;
LAB_0017c624:
        if (uVar1 != '4') {
          if (uVar1 != ',') goto LAB_0017c652;
          goto LAB_0017c630;
        }
        p = p->pLeft;
        goto LAB_0017c652;
      }
      if ((p->flags >> 0x13 & 1) == 0) {
        uVar1 = p->op;
        if (uVar1 != 'r') goto LAB_0017c624;
        pEVar4 = (ExprList_item *)&p->pLeft;
      }
      else {
        pEVar4 = ((p->x).pList)->a;
      }
      p = pEVar4->pExpr;
    } while (p != (Expr *)0x0);
  }
  goto LAB_0017c69c;
  while (p = p->pRight, p->op == ',') {
LAB_0017c630:
    iVar2 = sqlite3ExprImpliesNonNullRow(p->pLeft,iTab,isRJ);
    if (iVar2 != 0) {
      uVar3 = 1;
      goto LAB_0017c69c;
    }
  }
LAB_0017c652:
  local_58._8_8_ = impliesNotNullRow;
  local_58._16_8_ = (_func_int_Walker_ptr_Select_ptr *)0x0;
  local_58._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
  stack0xffffffffffffffc8 =
       (undefined1 *)(ulong)(CONCAT16(isRJ != 0,(int6)stack0xffffffffffffffc8) & 0xff0000ffffffff);
  aStack_30.n = iTab;
  if (p != (Expr *)0x0) {
    sqlite3WalkExprNN((Walker *)local_58,p);
    uVar3 = (uint)uStack_34;
  }
LAB_0017c69c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesNonNullRow(Expr *p, int iTab, int isRJ){
  Walker w;
  p = sqlite3ExprSkipCollateAndLikely(p);
  if( p==0 ) return 0;
  if( p->op==TK_NOTNULL ){
    p = p->pLeft;
  }else{
    while( p->op==TK_AND ){
      if( sqlite3ExprImpliesNonNullRow(p->pLeft, iTab, isRJ) ) return 1;
      p = p->pRight;
    }
  }
  w.xExprCallback = impliesNotNullRow;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;
  w.eCode = 0;
  w.mWFlags = isRJ!=0;
  w.u.iCur = iTab;
  sqlite3WalkExpr(&w, p);
  return w.eCode;
}